

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O3

void __thiscall
duckdb::CMChildInfo::CMChildInfo
          (CMChildInfo *this,LogicalOperator *op,column_binding_set_t *referenced_bindings)

{
  reference pvVar1;
  pointer pCVar2;
  pointer pCVar3;
  _Hash_node_base *p_Var4;
  size_type __n;
  bool bVar5;
  reference rVar6;
  allocator_type local_2a;
  bool local_29;
  
  (*op->_vptr_LogicalOperator[2])();
  this->types = &op->types;
  local_29 = true;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&this->can_compress,
             (long)(this->bindings_before).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->bindings_before).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_29,&local_2a);
  (this->bindings_after).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
  .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bindings_after).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
  .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindings_after).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
  .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var4 = (referenced_bindings->_M_h)._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    pCVar2 = (this->bindings_before).
             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pCVar3 = (this->bindings_before).
             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar5 = pCVar3 != pCVar2;
      pCVar3 = pCVar2;
      if (bVar5) {
        __n = 0;
        do {
          pvVar1 = vector<duckdb::ColumnBinding,_true>::operator[](&this->bindings_before,__n);
          if ((p_Var4[1]._M_nxt == (_Hash_node_base *)pvVar1->table_index) &&
             (p_Var4[2]._M_nxt == (_Hash_node_base *)pvVar1->column_index)) {
            rVar6 = vector<bool,_true>::get<true>(&this->can_compress,__n);
            *rVar6._M_p = *rVar6._M_p & ~rVar6._M_mask;
          }
          __n = __n + 1;
          pCVar2 = (this->bindings_before).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pCVar3 = (this->bindings_before).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (__n < (ulong)((long)pCVar3 - (long)pCVar2 >> 4));
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

CMChildInfo::CMChildInfo(LogicalOperator &op, const column_binding_set_t &referenced_bindings)
    : bindings_before(op.GetColumnBindings()), types(op.types), can_compress(bindings_before.size(), true) {
	for (const auto &binding : referenced_bindings) {
		for (idx_t binding_idx = 0; binding_idx < bindings_before.size(); binding_idx++) {
			if (binding == bindings_before[binding_idx]) {
				can_compress[binding_idx] = false;
			}
		}
	}
}